

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

sg_buffer sg_make_buffer(sg_buffer_desc *desc)

{
  sg_buffer buf_id_00;
  undefined1 local_78 [8];
  sg_buffer_desc desc_def;
  sg_buffer_desc *desc_local;
  sg_buffer buf_id;
  
  desc_def._88_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3ae7,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  if (desc == (sg_buffer_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3ae8,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  _sg_buffer_desc_defaults((sg_buffer_desc *)local_78,desc);
  buf_id_00 = _sg_alloc_buffer();
  if (buf_id_00.id == 0) {
    puts("buffer pool exhausted!");
  }
  else {
    _sg_init_buffer(buf_id_00,(sg_buffer_desc *)local_78);
  }
  return (sg_buffer)buf_id_00.id;
}

Assistant:

inline sg_buffer sg_make_buffer(const sg_buffer_desc& desc) { return sg_make_buffer(&desc); }